

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
cmConditionEvaluator::HandleLevel1
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *param_2,MessageType *param_3)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  size_t sVar3;
  bool bVar4;
  ostream *poVar5;
  string *psVar6;
  cmState *pcVar7;
  cmTest *pcVar8;
  cmValue cVar9;
  PolicyID id;
  size_t in_R8;
  static_string_view keyword;
  static_string_view keyword_00;
  static_string_view keyword_01;
  static_string_view keyword_02;
  static_string_view keyword_03;
  static_string_view keyword_04;
  static_string_view keyword_05;
  static_string_view keyword_06;
  static_string_view keyword_07;
  static_string_view keyword_08;
  CurrentAndNextIter args_00;
  static_string_view prefix;
  static_string_view prefix_00;
  CurrentAndNextIter args;
  string local_1c8;
  ostringstream e;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [22];
  
  args = cmArgumentList::make2ArgsIterator(newArgs);
  do {
    pcVar2 = DAT_0086e088;
    sVar3 = (anonymous_namespace)::keyTEST;
    if (args.current._M_node == (_List_node_base *)newArgs) {
      return true;
    }
    if (this->Policy64Status == WARN) {
      keyword.super_string_view._M_str = DAT_0086e088;
      keyword.super_string_view._M_len = (anonymous_namespace)::keyTEST;
      bVar4 = IsKeyword(this,keyword,(cmExpandedCommandArgument *)(args.current._M_node + 1));
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
        cmPolicies::GetPolicyWarning_abi_cxx11_(&local_1c8,(cmPolicies *)0x40,id);
        poVar5 = std::operator<<((ostream *)&e,(string *)&local_1c8);
        poVar5 = std::operator<<(poVar5,"\n");
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,pcVar2,sVar3);
        std::operator<<(poVar5,
                        " will be interpreted as an operator when the policy is set to NEW.  Since the policy is not set the OLD behavior will be used."
                       );
        std::__cxx11::string::~string((string *)&local_1c8);
        pcVar1 = this->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_1c8);
        std::__cxx11::string::~string((string *)&local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      }
    }
    if (args.next._M_node == (_List_node_base *)newArgs) goto LAB_0043a86e;
    keyword_00.super_string_view._M_str = DAT_0086df28;
    keyword_00.super_string_view._M_len = (anonymous_namespace)::keyEXISTS;
    bVar4 = IsKeyword(this,keyword_00,(cmExpandedCommandArgument *)(args.current._M_node + 1));
    if (bVar4) {
      psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                         ((cmExpandedCommandArgument *)(args.next._M_node + 1));
      bVar4 = cmsys::SystemTools::FileExists(psVar6);
LAB_0043a859:
LAB_0043a866:
      args_00.next._M_node = args.next._M_node;
      args_00.current._M_node = args.current._M_node;
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,bVar4,args_00);
    }
    else {
      keyword_01.super_string_view._M_str = DAT_0086df78;
      keyword_01.super_string_view._M_len = (anonymous_namespace)::keyIS_DIRECTORY;
      bVar4 = IsKeyword(this,keyword_01,(cmExpandedCommandArgument *)(args.current._M_node + 1));
      if (bVar4) {
        psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(args.next._M_node + 1));
        bVar4 = cmsys::SystemTools::FileIsDirectory(psVar6);
        goto LAB_0043a859;
      }
      keyword_02.super_string_view._M_str = DAT_0086df98;
      keyword_02.super_string_view._M_len = (anonymous_namespace)::keyIS_SYMLINK;
      bVar4 = IsKeyword(this,keyword_02,(cmExpandedCommandArgument *)(args.current._M_node + 1));
      if (bVar4) {
        psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(args.next._M_node + 1));
        bVar4 = cmsys::SystemTools::FileIsSymlink(psVar6);
        goto LAB_0043a859;
      }
      keyword_03.super_string_view._M_str = DAT_0086df68;
      keyword_03.super_string_view._M_len = (anonymous_namespace)::keyIS_ABSOLUTE;
      bVar4 = IsKeyword(this,keyword_03,(cmExpandedCommandArgument *)(args.current._M_node + 1));
      if (bVar4) {
        psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                           ((cmExpandedCommandArgument *)(args.next._M_node + 1));
        bVar4 = cmsys::SystemTools::FileIsFullPath(psVar6);
        goto LAB_0043a859;
      }
      keyword_04.super_string_view._M_str = DAT_0086def8;
      keyword_04.super_string_view._M_len = (anonymous_namespace)::keyCOMMAND;
      bVar4 = IsKeyword(this,keyword_04,(cmExpandedCommandArgument *)(args.current._M_node + 1));
      if (!bVar4) {
        keyword_05.super_string_view._M_str = DAT_0086e018;
        keyword_05.super_string_view._M_len = (anonymous_namespace)::keyPOLICY;
        bVar4 = IsKeyword(this,keyword_05,(cmExpandedCommandArgument *)(args.current._M_node + 1));
        if (bVar4) {
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(args.next._M_node + 1));
          bVar4 = cmPolicies::GetPolicyID((psVar6->_M_dataplus)._M_p,(PolicyID *)&e);
          goto LAB_0043a859;
        }
        keyword_06.super_string_view._M_str = DAT_0086e078;
        keyword_06.super_string_view._M_len = (anonymous_namespace)::keyTARGET;
        bVar4 = IsKeyword(this,keyword_06,(cmExpandedCommandArgument *)(args.current._M_node + 1));
        if (bVar4) {
          pcVar1 = this->Makefile;
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(args.next._M_node + 1));
          pcVar8 = (cmTest *)cmMakefile::FindTargetToUse(pcVar1,psVar6,false);
LAB_0043a97a:
          bVar4 = pcVar8 != (cmTest *)0x0;
        }
        else {
          keyword_07.super_string_view._M_str = DAT_0086df08;
          keyword_07.super_string_view._M_len = (anonymous_namespace)::keyDEFINED;
          bVar4 = IsKeyword(this,keyword_07,(cmExpandedCommandArgument *)(args.current._M_node + 1))
          ;
          if (!bVar4) {
            keyword_08.super_string_view._M_str = DAT_0086e088;
            keyword_08.super_string_view._M_len = (anonymous_namespace)::keyTEST;
            bVar4 = IsKeyword(this,keyword_08,
                              (cmExpandedCommandArgument *)(args.current._M_node + 1));
            if ((!bVar4) || (this->Policy64Status < NEW)) goto LAB_0043a86e;
            pcVar1 = this->Makefile;
            psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(args.next._M_node + 1));
            pcVar8 = cmMakefile::GetTest(pcVar1,psVar6);
            goto LAB_0043a97a;
          }
          psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                             ((cmExpandedCommandArgument *)(args.next._M_node + 1));
          pcVar2 = (char *)psVar6->_M_string_length;
          prefix.super_string_view._M_str = pcVar2;
          prefix.super_string_view._M_len = (size_t)"ENV";
          bVar4 = anon_unknown.dwarf_18ff9c6::looksLikeSpecialVariable
                            ((anon_unknown_dwarf_18ff9c6 *)psVar6,(string *)0x3,prefix,in_R8);
          if (bVar4) {
            psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(args.next._M_node + 1));
            std::__cxx11::string::substr((ulong)&e,(ulong)psVar6);
            bVar4 = cmsys::SystemTools::HasEnv((string *)&e);
LAB_0043aac3:
            std::__cxx11::string::~string((string *)&e);
          }
          else {
            prefix_00.super_string_view._M_str = pcVar2;
            prefix_00.super_string_view._M_len = (size_t)"CACHE";
            bVar4 = anon_unknown.dwarf_18ff9c6::looksLikeSpecialVariable
                              ((anon_unknown_dwarf_18ff9c6 *)psVar6,(string *)0x5,prefix_00,in_R8);
            if (bVar4) {
              psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                                 ((cmExpandedCommandArgument *)(args.next._M_node + 1));
              std::__cxx11::string::substr((ulong)&e,(ulong)psVar6);
              pcVar7 = cmMakefile::GetState(this->Makefile);
              cVar9 = cmState::GetCacheEntryValue(pcVar7,(string *)&e);
              bVar4 = cVar9.Value != (string *)0x0;
              goto LAB_0043aac3;
            }
            pcVar1 = this->Makefile;
            psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                               ((cmExpandedCommandArgument *)(args.next._M_node + 1));
            bVar4 = cmMakefile::IsDefinitionSet(pcVar1,psVar6);
          }
        }
        goto LAB_0043a866;
      }
      pcVar7 = cmMakefile::GetState(this->Makefile);
      psVar6 = cmExpandedCommandArgument::GetValue_abi_cxx11_
                         ((cmExpandedCommandArgument *)(args.next._M_node + 1));
      cmState::GetCommand((Command *)&e,pcVar7,psVar6);
      cmArgumentList::ReduceOneArg<cmConditionEvaluator::cmArgumentList::CurrentAndNextIter>
                (newArgs,local_198[0]._M_allocated_capacity != 0,args);
      std::_Function_base::~_Function_base((_Function_base *)&e);
    }
LAB_0043a86e:
    cmArgumentList::CurrentAndNextIter::advance
              (&args,&newArgs->
                      super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
              );
  } while( true );
}

Assistant:

bool cmConditionEvaluator::HandleLevel1(cmArgumentList& newArgs, std::string&,
                                        MessageType&)
{
  for (auto args = newArgs.make2ArgsIterator(); args.current != newArgs.end();
       args.advance(newArgs)) {

    auto policyCheck = [&, this](const cmPolicies::PolicyID id,
                                 const cmPolicies::PolicyStatus status,
                                 const cm::static_string_view kw) {
      if (status == cmPolicies::WARN && this->IsKeyword(kw, *args.current)) {
        std::ostringstream e;
        e << cmPolicies::GetPolicyWarning(id) << "\n"
          << kw
          << " will be interpreted as an operator "
             "when the policy is set to NEW.  "
             "Since the policy is not set the OLD behavior will be used.";

        this->Makefile.IssueMessage(MessageType::AUTHOR_WARNING, e.str());
      }
    };

    // NOTE Checking policies for warnings are not require an access to the
    // next arg. Check them first!
    policyCheck(cmPolicies::CMP0064, this->Policy64Status, keyTEST);

    // NOTE Fail fast: All the predicates below require the next arg to be
    // valid
    if (args.next == newArgs.end()) {
      continue;
    }

    // does a file exist
    if (this->IsKeyword(keyEXISTS, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileExists(args.next->GetValue()),
                           args);
    }
    // does a directory with this name exist
    else if (this->IsKeyword(keyIS_DIRECTORY, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsDirectory(args.next->GetValue()), args);
    }
    // does a symlink with this name exist
    else if (this->IsKeyword(keyIS_SYMLINK, *args.current)) {
      newArgs.ReduceOneArg(cmSystemTools::FileIsSymlink(args.next->GetValue()),
                           args);
    }
    // is the given path an absolute path ?
    else if (this->IsKeyword(keyIS_ABSOLUTE, *args.current)) {
      newArgs.ReduceOneArg(
        cmSystemTools::FileIsFullPath(args.next->GetValue()), args);
    }
    // does a command exist
    else if (this->IsKeyword(keyCOMMAND, *args.current)) {
      newArgs.ReduceOneArg(
        static_cast<bool>(
          this->Makefile.GetState()->GetCommand(args.next->GetValue())),
        args);
    }
    // does a policy exist
    else if (this->IsKeyword(keyPOLICY, *args.current)) {
      cmPolicies::PolicyID pid;
      newArgs.ReduceOneArg(
        cmPolicies::GetPolicyID(args.next->GetValue().c_str(), pid), args);
    }
    // does a target exist
    else if (this->IsKeyword(keyTARGET, *args.current)) {
      newArgs.ReduceOneArg(static_cast<bool>(this->Makefile.FindTargetToUse(
                             args.next->GetValue())),
                           args);
    }
    // is a variable defined
    else if (this->IsKeyword(keyDEFINED, *args.current)) {
      const auto& var = args.next->GetValue();
      const auto varNameLen = var.size();

      auto result = false;
      if (looksLikeSpecialVariable(var, "ENV"_s, varNameLen)) {
        const auto env = args.next->GetValue().substr(4, varNameLen - 5);
        result = cmSystemTools::HasEnv(env);
      }

      else if (looksLikeSpecialVariable(var, "CACHE"_s, varNameLen)) {
        const auto cache = args.next->GetValue().substr(6, varNameLen - 7);
        result = static_cast<bool>(
          this->Makefile.GetState()->GetCacheEntryValue(cache));
      }

      else {
        result = this->Makefile.IsDefinitionSet(args.next->GetValue());
      }
      newArgs.ReduceOneArg(result, args);
    }
    // does a test exist
    else if (this->IsKeyword(keyTEST, *args.current)) {
      if (this->Policy64Status == cmPolicies::OLD ||
          this->Policy64Status == cmPolicies::WARN) {
        continue;
      }
      newArgs.ReduceOneArg(
        static_cast<bool>(this->Makefile.GetTest(args.next->GetValue())),
        args);
    }
  }
  return true;
}